

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall
compiler::CompilerAstWalker::onExitDeclareStatementAstNode
          (CompilerAstWalker *this,DeclareStatementAstNode *node)

{
  bool mustBeTrue;
  string local_48;
  size_t local_28;
  size_t index;
  
  local_28 = 0;
  mustBeTrue = EmissionContext::GetDeclarationIndex
                         ((this->ec).
                          super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,&((node->identifier).
                                   super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                                  value,&local_28,true);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Could not find local declaration for declare statement",
             (allocator<char> *)((long)&index + 7));
  Error::assertWithPanic(mustBeTrue,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  EmissionContext::FullyBind
            ((this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,local_28);
  emit(this,SetLocal,local_28);
  return;
}

Assistant:

void onExitDeclareStatementAstNode(DeclareStatementAstNode* node) noexcept override {
    std::size_t index = 0;
    bool find = this->ec->GetDeclarationIndex(node->identifier->value, index, true);
    Error::assertWithPanic(find, "Could not find local declaration for declare statement");
    this->ec->FullyBind(index);
    this->emit(bytecode::ByteCodeInstruction::SetLocal, index);
  }